

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeMessageSetItem
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Message *pMVar4;
  undefined4 extraout_var;
  uint uVar5;
  Reflection *this;
  uint8_t *puVar6;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  *target = '\v';
  uVar2 = *(uint *)(field + 4);
  target[1] = '\x10';
  target[2] = (byte)uVar2;
  if (uVar2 < 0x80) {
    puVar6 = target + 3;
  }
  else {
    target[2] = (byte)uVar2 | 0x80;
    target[3] = (uint8_t)(uVar2 >> 7);
    puVar6 = target + 4;
    if (0x3fff < uVar2) {
      uVar5 = (uint)target[3];
      uVar2 = uVar2 >> 7;
      do {
        puVar6[-1] = (byte)uVar5 | 0x80;
        uVar5 = uVar2 >> 7;
        *puVar6 = (uint8_t)uVar5;
        puVar6 = puVar6 + 1;
        bVar1 = 0x3fff < uVar2;
        uVar2 = uVar5;
      } while (bVar1);
    }
  }
  pMVar4 = Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
  *puVar6 = '\x1a';
  uVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[9])(pMVar4);
  puVar6[1] = (uint8_t)uVar2;
  if (uVar2 < 0x80) {
    puVar6 = puVar6 + 2;
  }
  else {
    puVar6 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(uVar2,puVar6 + 1);
  }
  iVar3 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[0xb])(pMVar4,puVar6,stream);
  puVar6 = (uint8_t *)CONCAT44(extraout_var,iVar3);
  if (stream->end_ <= puVar6) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
  }
  *puVar6 = '\f';
  return puVar6 + 1;
}

Assistant:

uint8_t* WireFormat::InternalSerializeMessageSetItem(
    const FieldDescriptor* field, const Message& message, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, field->number(), target);
  // Write message.
  target = WireFormatLite::InternalWriteMessage(
      WireFormatLite::kMessageSetMessageNumber,
      message_reflection->GetMessage(message, field), target, stream);
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}